

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.cpp
# Opt level: O2

bool error_registers(int n,int regnumber)

{
  ostream *poVar1;
  
  if (regnumber <= n) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"<!> Overflow. Register \'");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,n);
    poVar1 = std::operator<<(poVar1,"\' does not exist.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return regnumber <= n;
}

Assistant:

bool error_registers(int n, int regnumber)
{

    if( n > ( regnumber - 1 ) )
    {
        std::cerr << "<!> Overflow. Register '" << n << "' does not exist." << std::endl;
        return true;
    }

    return false;

}